

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_fuse.hpp
# Opt level: O3

optional<enum_fuse_t>
magic_enum::enum_fuse<Color,Directions,Index>(Color values,Directions values_1,Index values_2)

{
  optional<unsigned_long> oVar1;
  optional<enum_fuse_t> oVar2;
  
  oVar1 = detail::fuse_enum<Color,Directions,Index>(values,values_1,values_2);
  oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
  super__Optional_payload_base<enum_fuse_t>._M_payload._M_value =
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
    super__Optional_payload_base<enum_fuse_t>._8_8_ =
         oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._8_8_ & 0xffffffffffffff01;
    return (optional<enum_fuse_t>)
           oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
           super__Optional_payload_base<enum_fuse_t>;
  }
  __assert_fail("(fuse)",
                "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/include/magic_enum/magic_enum_fuse.hpp"
                ,0x54,"auto magic_enum::enum_fuse(Es...) [Es = <Color, Directions, Index>]");
}

Assistant:

[[nodiscard]] constexpr auto enum_fuse(Es... values) noexcept {
  static_assert((std::is_enum_v<std::decay_t<Es>> && ...), "magic_enum::enum_fuse requires enum type.");
  static_assert(sizeof...(Es) >= 2, "magic_enum::enum_fuse requires at least 2 values.");
  static_assert((detail::log2(enum_count<std::decay_t<Es>>() + 1) + ...) <= (sizeof(std::uintmax_t) * 8), "magic_enum::enum_fuse does not work for large enums");
#if defined(MAGIC_ENUM_NO_TYPESAFE_ENUM_FUSE)
  const auto fuse = detail::fuse_enum<std::decay_t<Es>...>(values...);
#else
  const auto fuse = detail::typesafe_fuse_enum<std::decay_t<Es>...>(values...);
#endif
  return MAGIC_ENUM_ASSERT(fuse), fuse;
}